

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_shortname(char *out,GCstr *str,BCLine line)

{
  GCstr *__src;
  ulong uVar1;
  char *pcVar2;
  ulong local_38;
  size_t len_1;
  size_t len;
  char *src;
  BCLine line_local;
  GCstr *str_local;
  char *out_local;
  
  __src = str + 1;
  if ((char)(__src->nextgc).gcptr64 == '=') {
    strncpy(out,(char *)((long)&str[1].nextgc.gcptr64 + 1),0x3c);
    out[0x3b] = '\0';
  }
  else if ((char)(__src->nextgc).gcptr64 == '@') {
    uVar1 = (ulong)(str->len - 1);
    len = (long)&str[1].nextgc.gcptr64 + 1;
    str_local = (GCstr *)out;
    if (0x3b < uVar1) {
      len = len + (uVar1 - 0x38);
      *out = '.';
      out[1] = '.';
      str_local = (GCstr *)(out + 3);
      out[2] = '.';
    }
    strcpy((char *)str_local,(char *)len);
  }
  else {
    for (local_38 = 0;
        (local_38 < 0x30 && (0x1f < *(byte *)((long)&(__src->nextgc).gcptr64 + local_38)));
        local_38 = local_38 + 1) {
    }
    pcVar2 = "[string \"";
    if (line == -1) {
      pcVar2 = "[builtin:";
    }
    strcpy(out,pcVar2);
    pcVar2 = out + 9;
    if (*(char *)((long)&(__src->nextgc).gcptr64 + local_38) == '\0') {
      strcpy(pcVar2,(char *)__src);
      str_local = (GCstr *)(pcVar2 + local_38);
    }
    else {
      if (0x2d < local_38) {
        local_38 = 0x2d;
      }
      strncpy(pcVar2,(char *)__src,local_38);
      strcpy(pcVar2 + local_38,"...");
      str_local = (GCstr *)(pcVar2 + local_38 + 3);
    }
    pcVar2 = "\"]";
    if (line == -1) {
      pcVar2 = "]";
    }
    strcpy((char *)str_local,pcVar2);
  }
  return;
}

Assistant:

void lj_debug_shortname(char *out, GCstr *str, BCLine line)
{
  const char *src = strdata(str);
  if (*src == '=') {
    strncpy(out, src+1, LUA_IDSIZE);  /* Remove first char. */
    out[LUA_IDSIZE-1] = '\0';  /* Ensures null termination. */
  } else if (*src == '@') {  /* Output "source", or "...source". */
    size_t len = str->len-1;
    src++;  /* Skip the `@' */
    if (len >= LUA_IDSIZE) {
      src += len-(LUA_IDSIZE-4);  /* Get last part of file name. */
      *out++ = '.'; *out++ = '.'; *out++ = '.';
    }
    strcpy(out, src);
  } else {  /* Output [string "string"] or [builtin:name]. */
    size_t len;  /* Length, up to first control char. */
    for (len = 0; len < LUA_IDSIZE-12; len++)
      if (((const unsigned char *)src)[len] < ' ') break;
    strcpy(out, line == ~(BCLine)0 ? "[builtin:" : "[string \""); out += 9;
    if (src[len] != '\0') {  /* Must truncate? */
      if (len > LUA_IDSIZE-15) len = LUA_IDSIZE-15;
      strncpy(out, src, len); out += len;
      strcpy(out, "..."); out += 3;
    } else {
      strcpy(out, src); out += len;
    }
    strcpy(out, line == ~(BCLine)0 ? "]" : "\"]");
  }
}